

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall xemmai::t_object::f_decrement_push(t_object *this)

{
  size_t sVar1;
  t_object *this_local;
  
  if (this->v_count == 0) {
    __assert_fail("v_count > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/include/xemmai/object.h"
                  ,0x6e,"void xemmai::t_object::f_decrement_push()");
  }
  sVar1 = this->v_count - 1;
  this->v_count = sVar1;
  if (sVar1 == 0) {
    f_push(this);
  }
  else {
    this->v_color = c_color__PURPLE;
    if (this->v_next == (t_object *)0x0) {
      f_append(this);
    }
  }
  return;
}

Assistant:

void f_decrement_push()
	{
		assert(v_count > 0);
		if (--v_count > 0) {
			v_color = c_color__PURPLE;
			if (!v_next) f_append(this);
		} else {
			f_push(this);
		}
	}